

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyMan.c
# Opt level: O1

Ivy_Man_t * Ivy_ManDup(Ivy_Man_t *p)

{
  void *pvVar1;
  int iVar2;
  Vec_Int_t *in_RAX;
  Vec_Int_t *__ptr;
  Ivy_Man_t *p_00;
  Ivy_Obj_t *pIVar3;
  Vec_Ptr_t *pVVar4;
  ulong uVar5;
  ulong uVar6;
  Ivy_Obj_t *p1;
  long lVar7;
  Vec_Int_t *vLatches;
  Vec_Int_t *local_38;
  
  local_38 = in_RAX;
  __ptr = Ivy_ManDfsSeq(p,&local_38);
  p_00 = Ivy_ManStart();
  p->pConst1->pEquiv = p_00->pConst1;
  pVVar4 = p->vPis;
  if (0 < pVVar4->nSize) {
    lVar7 = 0;
    do {
      pvVar1 = pVVar4->pArray[lVar7];
      pIVar3 = Ivy_ObjCreatePi(p_00);
      *(Ivy_Obj_t **)((long)pvVar1 + 0x48) = pIVar3;
      lVar7 = lVar7 + 1;
      pVVar4 = p->vPis;
    } while (lVar7 < pVVar4->nSize);
  }
  if (0 < local_38->nSize) {
    lVar7 = 0;
    do {
      iVar2 = local_38->pArray[lVar7];
      if (((long)iVar2 < 0) || (p->vObjs->nSize <= iVar2)) goto LAB_007ea65f;
      pvVar1 = p->vObjs->pArray[iVar2];
      if (pvVar1 == (void *)0x0) break;
      pIVar3 = Ivy_ObjCreatePi(p_00);
      *(Ivy_Obj_t **)((long)pvVar1 + 0x48) = pIVar3;
      lVar7 = lVar7 + 1;
    } while (lVar7 < local_38->nSize);
  }
  if (0 < __ptr->nSize) {
    lVar7 = 0;
    do {
      iVar2 = __ptr->pArray[lVar7];
      if (((long)iVar2 < 0) || (p->vObjs->nSize <= iVar2)) goto LAB_007ea65f;
      pvVar1 = p->vObjs->pArray[iVar2];
      if (pvVar1 == (void *)0x0) break;
      if ((*(uint *)((long)pvVar1 + 8) & 0xf) == 7) {
        if (((ulong)pvVar1 & 1) != 0) goto LAB_007ea67e;
        uVar6 = *(ulong *)((long)pvVar1 + 0x10) & 0xfffffffffffffffe;
        if (uVar6 == 0) {
          pIVar3 = (Ivy_Obj_t *)0x0;
        }
        else {
          pIVar3 = (Ivy_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar1 + 0x10) & 1) ^ *(ulong *)(uVar6 + 0x48));
        }
      }
      else {
        if (((ulong)pvVar1 & 1) != 0) goto LAB_007ea67e;
        uVar6 = *(ulong *)((long)pvVar1 + 0x10) & 0xfffffffffffffffe;
        if (uVar6 == 0) {
          pIVar3 = (Ivy_Obj_t *)0x0;
        }
        else {
          pIVar3 = (Ivy_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar1 + 0x10) & 1) ^ *(ulong *)(uVar6 + 0x48));
        }
        uVar6 = *(ulong *)((long)pvVar1 + 0x18) & 0xfffffffffffffffe;
        if (uVar6 == 0) {
          p1 = (Ivy_Obj_t *)0x0;
        }
        else {
          p1 = (Ivy_Obj_t *)
               ((ulong)((uint)*(ulong *)((long)pvVar1 + 0x18) & 1) ^ *(ulong *)(uVar6 + 0x48));
        }
        pIVar3 = Ivy_And(p_00,pIVar3,p1);
      }
      *(Ivy_Obj_t **)((long)pvVar1 + 0x48) = pIVar3;
      lVar7 = lVar7 + 1;
    } while (lVar7 < __ptr->nSize);
  }
  pVVar4 = p->vPos;
  if (0 < pVVar4->nSize) {
    lVar7 = 0;
    do {
      if (((ulong)pVVar4->pArray[lVar7] & 1) != 0) goto LAB_007ea67e;
      uVar6 = *(ulong *)((long)pVVar4->pArray[lVar7] + 0x10);
      uVar5 = uVar6 & 0xfffffffffffffffe;
      if (uVar5 == 0) {
        pIVar3 = (Ivy_Obj_t *)0x0;
      }
      else {
        pIVar3 = (Ivy_Obj_t *)((ulong)((uint)uVar6 & 1) ^ *(ulong *)(uVar5 + 0x48));
      }
      Ivy_ObjCreatePo(p_00,pIVar3);
      lVar7 = lVar7 + 1;
      pVVar4 = p->vPos;
    } while (lVar7 < pVVar4->nSize);
  }
  if (0 < local_38->nSize) {
    lVar7 = 0;
    do {
      iVar2 = local_38->pArray[lVar7];
      if (((long)iVar2 < 0) || (p->vObjs->nSize <= iVar2)) {
LAB_007ea65f:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar1 = p->vObjs->pArray[iVar2];
      if (pvVar1 == (void *)0x0) break;
      if ((*(byte *)((long)pvVar1 + 0x10) & 1) != 0) {
        __assert_fail("!Ivy_ObjFaninC0(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyMan.c"
                      ,0x8b,"Ivy_Man_t *Ivy_ManDup(Ivy_Man_t *)");
      }
      *(uint *)(*(long *)((long)pvVar1 + 0x48) + 8) =
           *(uint *)(*(long *)((long)pvVar1 + 0x48) + 8) & 0xfffffff0 | 4;
      *(uint *)(*(long *)((long)pvVar1 + 0x48) + 8) =
           *(uint *)(*(long *)((long)pvVar1 + 0x48) + 8) & 0xfffff9ff |
           *(uint *)((long)pvVar1 + 8) & 0x600;
      if (((ulong)pvVar1 & 1) != 0) {
LAB_007ea67e:
        __assert_fail("!Ivy_IsComplement(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivy.h"
                      ,0x113,"Ivy_Obj_t *Ivy_ObjChild0Equiv(Ivy_Obj_t *)");
      }
      uVar6 = *(ulong *)((long)pvVar1 + 0x10) & 0xfffffffffffffffe;
      if (uVar6 == 0) {
        pIVar3 = (Ivy_Obj_t *)0x0;
      }
      else {
        pIVar3 = (Ivy_Obj_t *)
                 ((ulong)((uint)*(ulong *)((long)pvVar1 + 0x10) & 1) ^ *(ulong *)(uVar6 + 0x48));
      }
      Ivy_ObjConnect(p_00,*(Ivy_Obj_t **)((long)pvVar1 + 0x48),pIVar3,(Ivy_Obj_t *)0x0);
      lVar7 = lVar7 + 1;
    } while (lVar7 < local_38->nSize);
  }
  if (p_00->vPis->nSize < p->nObjs[1]) {
    __assert_fail("p->nSize >= nSizeNew",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                  ,0x232,"void Vec_PtrShrink(Vec_Ptr_t *, int)");
  }
  p_00->vPis->nSize = p->nObjs[1];
  p_00->nObjs[1] = p_00->nObjs[1] - p->nObjs[4];
  p_00->nObjs[4] = p_00->nObjs[4] + p->nObjs[4];
  if (__ptr->pArray != (int *)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (int *)0x0;
  }
  if (__ptr != (Vec_Int_t *)0x0) {
    free(__ptr);
  }
  if (local_38->pArray != (int *)0x0) {
    free(local_38->pArray);
    local_38->pArray = (int *)0x0;
  }
  if (local_38 != (Vec_Int_t *)0x0) {
    free(local_38);
  }
  if (p->nObjs[6] + p->nObjs[5] == p_00->nObjs[6] + p_00->nObjs[5]) {
    if (p->nObjs[4] == p_00->nObjs[4]) {
      iVar2 = Ivy_ManCheck(p_00);
      if (iVar2 == 0) {
        puts("Ivy_ManMakeSeq(): The check has failed.");
      }
      return p_00;
    }
    __assert_fail("Ivy_ManLatchNum(p) == Ivy_ManLatchNum(pNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyMan.c"
                  ,0x9a,"Ivy_Man_t *Ivy_ManDup(Ivy_Man_t *)");
  }
  __assert_fail("Ivy_ManNodeNum(p) == Ivy_ManNodeNum(pNew)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyMan.c"
                ,0x99,"Ivy_Man_t *Ivy_ManDup(Ivy_Man_t *)");
}

Assistant:

Ivy_Man_t * Ivy_ManDup( Ivy_Man_t * p )
{
    Vec_Int_t * vNodes, * vLatches;
    Ivy_Man_t * pNew;
    Ivy_Obj_t * pObj;
    int i;
    // collect latches and nodes in the DFS order
    vNodes = Ivy_ManDfsSeq( p, &vLatches );
    // create the new manager
    pNew = Ivy_ManStart();
    // create the PIs
    Ivy_ManConst1(p)->pEquiv = Ivy_ManConst1(pNew);
    Ivy_ManForEachPi( p, pObj, i )
        pObj->pEquiv = Ivy_ObjCreatePi(pNew);
    // create the fake PIs for latches
    Ivy_ManForEachNodeVec( p, vLatches, pObj, i )
        pObj->pEquiv = Ivy_ObjCreatePi(pNew);
    // duplicate internal nodes
    Ivy_ManForEachNodeVec( p, vNodes, pObj, i )
        if ( Ivy_ObjIsBuf(pObj) )
            pObj->pEquiv = Ivy_ObjChild0Equiv(pObj);
        else
            pObj->pEquiv = Ivy_And( pNew, Ivy_ObjChild0Equiv(pObj), Ivy_ObjChild1Equiv(pObj) );
    // add the POs
    Ivy_ManForEachPo( p, pObj, i )
        Ivy_ObjCreatePo( pNew, Ivy_ObjChild0Equiv(pObj) );
    // transform additional PI nodes into latches and connect them
    Ivy_ManForEachNodeVec( p, vLatches, pObj, i )
    {
        assert( !Ivy_ObjFaninC0(pObj) );
        pObj->pEquiv->Type = IVY_LATCH;
        pObj->pEquiv->Init = pObj->Init;
        Ivy_ObjConnect( pNew, pObj->pEquiv, Ivy_ObjChild0Equiv(pObj), NULL );
    }
    // shrink the arrays
    Vec_PtrShrink( pNew->vPis, Ivy_ManPiNum(p) );
    // update the counters of different objects
    pNew->nObjs[IVY_PI] -= Ivy_ManLatchNum(p);
    pNew->nObjs[IVY_LATCH] += Ivy_ManLatchNum(p);
    // free arrays
    Vec_IntFree( vNodes );
    Vec_IntFree( vLatches );
    // make sure structural hashing did not change anything
    assert( Ivy_ManNodeNum(p)  == Ivy_ManNodeNum(pNew) );
    assert( Ivy_ManLatchNum(p) == Ivy_ManLatchNum(pNew) );
    // check the resulting network
    if ( !Ivy_ManCheck(pNew) )
        printf( "Ivy_ManMakeSeq(): The check has failed.\n" );
    return pNew;
}